

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  ColourImpl *colourImpl_;
  ostream *poVar4;
  byte local_81;
  undefined1 local_80 [8];
  ConsoleAssertionPrinter printer;
  bool includeResults;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  ConsoleReporter *this_local;
  
  uVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_81 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult);
    local_81 = bVar1 ^ 0xff;
  }
  printer._87_1_ = local_81 & 1;
  if (((printer._87_1_ != 0) ||
      (OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult), OVar3 == Warning))
     || (OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult),
        OVar3 == ExplicitSkip)) {
    lazyPrint(this);
    poVar4 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    colourImpl_ = Detail::unique_ptr<Catch::ColourImpl>::get
                            (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    anon_unknown_26::ConsoleAssertionPrinter::ConsoleAssertionPrinter
              ((ConsoleAssertionPrinter *)local_80,poVar4,_assertionStats,colourImpl_,
               (bool)(printer._87_1_ & 1));
    anon_unknown_26::ConsoleAssertionPrinter::print((ConsoleAssertionPrinter *)local_80);
    poVar4 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}